

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall kj::anon_unknown_36::WebSocketImpl::disconnect(WebSocketImpl *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 node;
  
  if ((this->sendingControlMessage).ptr.isSet == true) {
    (this->sendingControlMessage).ptr.isSet = false;
    node = (this->sendingControlMessage).ptr.field_1;
    if (node != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
      (this->sendingControlMessage).ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
  }
  this->disconnected = true;
  (*(((this->stream).ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[6])();
  return;
}

Assistant:

void disconnect() override {
    // NOTE: While it's true that disconnect() is UB if called while a send is still in progress,
    // it would be inappropriate for us to assert !currentlySending here because currentlySending
    // remains true after a send is canceled, and it is OK to call disconnect() after canceling
    // a send.

    // If we're sending a control message (e.g. a PONG), cancel it.
    sendingControlMessage = kj::none;

    disconnected = true;
    stream->shutdownWrite();
  }